

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O1

dynamic_bit_vector * bsim::andr(dynamic_bit_vector *__return_storage_ptr__,dynamic_bit_vector *a)

{
  uint uVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  string local_38;
  
  uVar1 = a->N;
  bVar3 = 0 < (int)uVar1;
  if (0 < (int)uVar1) {
    pbVar2 = (a->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((*pbVar2 & 1) != 0) {
      uVar4 = 1;
      do {
        uVar5 = uVar4;
        if (uVar1 == uVar5) goto LAB_00174d4e;
        uVar4 = uVar5 + 1;
      } while ((pbVar2[uVar5 >> 3] >> (uVar5 & 7) & 1) != 0);
      bVar3 = (int)uVar5 < (int)uVar1;
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"0","");
    dynamic_bit_vector::dynamic_bit_vector(__return_storage_ptr__,1,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (bVar3) {
      return __return_storage_ptr__;
    }
  }
LAB_00174d4e:
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"1","");
  dynamic_bit_vector::dynamic_bit_vector(__return_storage_ptr__,1,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline dynamic_bit_vector
  andr(const dynamic_bit_vector& a) {
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) != 1) {
	return dynamic_bit_vector(1, "0");
      }
    }

    return dynamic_bit_vector(1, "1");
  }